

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerLdFld(Lowerer *this,Instr *ldFldInstr,JnHelperMethod helperMethod,
                   JnHelperMethod polymorphicHelperMethod,bool useInlineCache,
                   LabelInstr *labelBailOut,bool isHelper)

{
  code *pcVar1;
  bool bVar2;
  JitProfilingInstr *ldFldInstr_00;
  Instr *pIVar3;
  Opnd *this_00;
  Opnd *pOVar4;
  undefined4 *puVar5;
  SymOpnd *pSVar6;
  PropertySymOpnd *pPVar7;
  intptr_t address;
  IntConstOpnd *opndArg;
  RegOpnd *opndBailOutArg;
  PropertySymOpnd *local_e0;
  RegOpnd *opndBase;
  JITTimePolymorphicInlineCache *polymorphicInlineCache;
  Opnd *inlineCacheOpnd;
  Opnd *src2;
  Instr *instrPrev;
  Opnd *src;
  bool isHelper_local;
  LabelInstr *labelBailOut_local;
  JnHelperMethod JStack_24;
  bool useInlineCache_local;
  JnHelperMethod polymorphicHelperMethod_local;
  JnHelperMethod helperMethod_local;
  Instr *ldFldInstr_local;
  Lowerer *this_local;
  
  bVar2 = IR::Instr::IsJitProfilingInstr(ldFldInstr);
  if (bVar2) {
    ldFldInstr_00 = IR::Instr::AsJitProfilingInstr(ldFldInstr);
    pIVar3 = LowerProfiledLdFld(this,ldFldInstr_00);
    return pIVar3;
  }
  pIVar3 = ldFldInstr->m_prev;
  this_00 = IR::Instr::UnlinkSrc1(ldFldInstr);
  if (ldFldInstr->m_opcode == LdSuperFld) {
    pOVar4 = IR::Instr::UnlinkSrc2(ldFldInstr);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,ldFldInstr,pOVar4);
  }
  bVar2 = IR::Opnd::IsSymOpnd(this_00);
  if (bVar2) {
    pSVar6 = IR::Opnd::AsSymOpnd(this_00);
    bVar2 = Sym::IsPropertySym(pSVar6->m_sym);
    if (bVar2) goto LAB_0078a3a2;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x178b,"(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym())",
                     "Expected property sym as src");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 0;
LAB_0078a3a2:
  JStack_24 = helperMethod;
  if (useInlineCache) {
    pSVar6 = IR::Opnd::AsSymOpnd(this_00);
    bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar6);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1790,"(src->AsSymOpnd()->IsPropertySymOpnd())",
                         "Need property sym operand to find the inline cache");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pPVar7 = IR::Opnd::AsPropertySymOpnd(this_00);
    if ((pPVar7->m_runtimePolymorphicInlineCache == (JITTimePolymorphicInlineCache *)0x0) ||
       (polymorphicHelperMethod == helperMethod)) {
      pPVar7 = IR::Opnd::AsPropertySymOpnd(this_00);
      polymorphicInlineCache =
           (JITTimePolymorphicInlineCache *)
           LoadRuntimeInlineCacheOpnd(this,ldFldInstr,pPVar7,isHelper);
    }
    else {
      pPVar7 = IR::Opnd::AsPropertySymOpnd(this_00);
      address = JITTimePolymorphicInlineCache::GetAddr(pPVar7->m_runtimePolymorphicInlineCache);
      polymorphicInlineCache =
           (JITTimePolymorphicInlineCache *)
           IR::AddrOpnd::New(address,AddrOpndKindDynamicInlineCache,this->m_func,false,(Var)0x0);
      JStack_24 = polymorphicHelperMethod;
    }
    LoadPropertySymAsArgument(this,ldFldInstr,this_00);
    pPVar7 = IR::Opnd::AsPropertySymOpnd(this_00);
    opndArg = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar7->m_inlineCacheIndex,this->m_func);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,ldFldInstr,&opndArg->super_Opnd);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,ldFldInstr,(Opnd *)polymorphicInlineCache);
    pOVar4 = LoadFunctionBodyOpnd(this,ldFldInstr);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,ldFldInstr,pOVar4);
  }
  else {
    LoadScriptContext(this,ldFldInstr);
    LoadPropertySymAsArgument(this,ldFldInstr,this_00);
  }
  pSVar6 = IR::Opnd::AsSymOpnd(this_00);
  opndBailOutArg = IR::SymOpnd::CreatePropertyOwnerOpnd(pSVar6,this->m_func);
  pSVar6 = IR::Opnd::AsSymOpnd(this_00);
  bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar6);
  if (bVar2) {
    pSVar6 = IR::Opnd::AsSymOpnd(this_00);
    local_e0 = IR::Opnd::AsPropertySymOpnd(&pSVar6->super_Opnd);
  }
  else {
    local_e0 = (PropertySymOpnd *)0x0;
  }
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,ldFldInstr,JStack_24,labelBailOut,&opndBailOutArg->super_Opnd,
             local_e0,isHelper);
  return pIVar3;
}

Assistant:

IR::Instr *
Lowerer::LowerLdFld(
    IR::Instr * ldFldInstr,
    IR::JnHelperMethod helperMethod,
    IR::JnHelperMethod polymorphicHelperMethod,
    bool useInlineCache,
    IR::LabelInstr *labelBailOut,
    bool isHelper)
{
    if (ldFldInstr->IsJitProfilingInstr())
    {
        // If we want to profile then do something completely different
        return this->LowerProfiledLdFld(ldFldInstr->AsJitProfilingInstr());
    }

    IR::Opnd *src;
    IR::Instr *instrPrev = ldFldInstr->m_prev;

    src = ldFldInstr->UnlinkSrc1();
    if (ldFldInstr->m_opcode == Js::OpCode::LdSuperFld)
    {
        IR::Opnd * src2 = nullptr;
        src2 = ldFldInstr->UnlinkSrc2();
        m_lowererMD.LoadHelperArgument(ldFldInstr, src2);
    }

    AssertMsg(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym(), "Expected property sym as src");

    if (useInlineCache)
    {
        IR::Opnd * inlineCacheOpnd;
        AssertMsg(src->AsSymOpnd()->IsPropertySymOpnd(), "Need property sym operand to find the inline cache");
        if (src->AsPropertySymOpnd()->m_runtimePolymorphicInlineCache && polymorphicHelperMethod != helperMethod)
        {
            JITTimePolymorphicInlineCache * polymorphicInlineCache = src->AsPropertySymOpnd()->m_runtimePolymorphicInlineCache;
            helperMethod = polymorphicHelperMethod;
            inlineCacheOpnd = IR::AddrOpnd::New(polymorphicInlineCache->GetAddr(), IR::AddrOpndKindDynamicInlineCache, this->m_func);
        }
        else
        {
            // Need to load runtime inline cache opnd first before loading any helper argument
            // because LoadRuntimeInlineCacheOpnd may create labels marked as helper,
            // and cause op helper register push/pop save in x86, messing up with any helper arguments that is already pushed
            inlineCacheOpnd = this->LoadRuntimeInlineCacheOpnd(ldFldInstr, src->AsPropertySymOpnd(), isHelper);
        }
        this->LoadPropertySymAsArgument(ldFldInstr, src);
        this-> m_lowererMD.LoadHelperArgument(
            ldFldInstr,
            IR::Opnd::CreateInlineCacheIndexOpnd(src->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));

        this->m_lowererMD.LoadHelperArgument(ldFldInstr, inlineCacheOpnd);
        this->m_lowererMD.LoadHelperArgument(ldFldInstr, LoadFunctionBodyOpnd(ldFldInstr));
    }
    else
    {
        LoadScriptContext(ldFldInstr);
        this->LoadPropertySymAsArgument(ldFldInstr, src);
    }

    // Do we need to reload the type and slot array after the helper returns?
    // (We do if there's a propertySymOpnd downstream that needs it, i.e., the type is not dead.)
    IR::RegOpnd *opndBase = src->AsSymOpnd()->CreatePropertyOwnerOpnd(m_func);
    m_lowererMD.ChangeToHelperCall(ldFldInstr, helperMethod, labelBailOut, opndBase, src->AsSymOpnd()->IsPropertySymOpnd() ? src->AsSymOpnd()->AsPropertySymOpnd() : nullptr, isHelper);

    return instrPrev;
}